

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

bool getOrTestValue(cmState *state,string *key,string *value,string *keyDescription,
                   string *errorMessage)

{
  bool bVar1;
  char *__s;
  bool bVar2;
  string cachedValue;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __s = cmState::GetCacheEntryValue(state,key);
  if (__s == (char *)0x0) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,__s,(allocator<char> *)&local_c8);
  }
  if (value->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)value);
  }
  bVar2 = true;
  if (local_e8._M_string_length != 0) {
    bVar1 = std::operator!=(&local_e8,value);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"\"",&local_e9);
      std::operator+(&local_88,&local_a8,key);
      std::operator+(&local_68,&local_88,"\" is set but incompatible with configured ");
      std::operator+(&local_48,&local_68,keyDescription);
      std::operator+(&local_c8,&local_48," value.");
      setErrorMessage(errorMessage,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      bVar2 = false;
    }
  }
  std::__cxx11::string::~string((string *)&local_e8);
  return bVar2;
}

Assistant:

static bool getOrTestValue(cmState* state, const std::string& key,
                           std::string& value,
                           const std::string& keyDescription,
                           std::string* errorMessage)
{
  const char* entry = state->GetCacheEntryValue(key);
  const std::string cachedValue =
    entry == nullptr ? std::string() : std::string(entry);
  if (value.empty()) {
    value = cachedValue;
  }
  if (!cachedValue.empty() && cachedValue != value) {
    setErrorMessage(errorMessage,
                    std::string("\"") + key +
                      "\" is set but incompatible with configured " +
                      keyDescription + " value.");
    return false;
  }
  return true;
}